

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O0

void __thiscall OpenMD::P2R::writeP2R(P2R *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  ostream *poVar5;
  ulong uVar6;
  undefined8 uVar7;
  StaticAnalyser *in_RDI;
  Revision rev;
  ofstream ofs;
  Revision *in_stack_fffffffffffffd28;
  string local_258 [32];
  string local_238 [48];
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar7 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"P2R: unable to open %s\n",uVar7);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<(local_208,"# ");
    psVar4 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,"\n");
    poVar5 = std::operator<<(local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((Revision *)poVar3);
    poVar3 = std::operator<<(poVar5,local_238);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_238);
    poVar3 = std::operator<<(local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffd28);
    poVar3 = std::operator<<(poVar3,local_258);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_258);
    poVar3 = std::operator<<(local_208,"#nFrames:\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&in_RDI[0x11].info_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"#selection1: (");
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI[1].dumpFilename_);
    std::operator<<(poVar3,")");
    if (((ulong)in_RDI[1].info_ & 1) == 0) {
      poVar3 = std::operator<<(local_208,"\tselection2: (");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI[1].step_);
      std::operator<<(poVar3,")");
    }
    std::operator<<(local_208,"\n");
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      poVar3 = std::operator<<(local_208,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI->paramString_);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<(local_208,"#P2 correlation:\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_208,*(double *)&in_RDI[0x11].dumpFilename_);
    std::operator<<(poVar3,"\n");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void P2R::writeP2R() {
    std::ofstream ofs(outputFilename_.c_str());
    if (ofs.is_open()) {
      Revision rev;

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << rev.getFullRevision() << "\n";
      ofs << "# " << rev.getBuildDate() << "\n";
      ofs << "#nFrames:\t" << nProcessed_ << "\n";
      ofs << "#selection1: (" << selectionScript1_ << ")";
      if (!doVect_) { ofs << "\tselection2: (" << selectionScript2_ << ")"; }
      ofs << "\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#P2 correlation:\n";
      ofs << P2_ << "\n";

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "P2R: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }